

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::TextureWrapCase::iterate(TextureWrapCase *this)

{
  TestLog *log;
  pointer pbVar1;
  pointer pbVar2;
  RenderContext *pRVar3;
  int y;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  RGBA threshold;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *description;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Texture2DView local_150;
  Sampler local_140;
  TextureRenderer *local_100;
  Surface referenceFrame;
  Surface renderedFrame;
  ReferenceParams local_c4;
  long lVar8;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar5),0x100,0x100,dVar6);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  pbVar1 = (this->m_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_c4,TEXTURETYPE_2D);
  iVar5 = viewport.width / 2;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_140.wrapS =
       (WrapMode)
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_01,iVar7) + 8));
  local_150.m_numLevels = 0x7070707;
  if (pbVar1 == pbVar2) {
    local_150.m_numLevels = 0x3030303;
  }
  threshold = tcu::operator+((RGBA *)&local_140,(RGBA *)&local_150);
  (**(code **)(lVar8 + 8))(0x84c0);
  (**(code **)(lVar8 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2800,this->m_magFilter);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureWrapTests.cpp"
                  ,0xb9);
  glu::mapGLSampler(&local_140,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
  local_c4.sampler.compareChannel = local_140.compareChannel;
  local_c4.sampler.magFilter = local_140.magFilter;
  local_c4.sampler.lodThreshold = local_140.lodThreshold;
  local_c4.sampler.normalizedCoords = local_140.normalizedCoords;
  local_c4.sampler._25_3_ = local_140._25_3_;
  local_c4.sampler.compare = local_140.compare;
  local_c4.sampler.wrapS = local_140.wrapS;
  local_c4.sampler.wrapT = local_140.wrapT;
  local_c4.sampler.wrapR = local_140.wrapR;
  local_c4.sampler.minFilter = local_140.minFilter;
  local_c4.sampler.borderColor.v.uData[0] = local_140.borderColor.v.uData[0];
  local_c4.sampler.borderColor.v.uData[1] = local_140.borderColor.v.uData[1];
  local_c4.sampler.borderColor.v.uData[2] = local_140.borderColor.v.uData[2];
  local_c4.sampler.borderColor.v.uData[3] = local_140.borderColor.v.uData[3];
  local_c4.sampler.seamlessCubeMap = local_140.seamlessCubeMap;
  local_c4.sampler._53_3_ = local_140._53_3_;
  local_c4.sampler.depthStencilMode = local_140.depthStencilMode;
  local_c4.lodMode = LODMODE_EXACT;
  (**(code **)(lVar8 + 0x1a00))(viewport.x,viewport.y,iVar5,viewport.height);
  local_140.wrapS = 0xbfc00000;
  local_140.wrapT = 0xc0400000;
  local_150.m_numLevels = 0x3fc00000;
  local_150._4_4_ = 0x40200000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)&local_140,(Vec2 *)&local_150);
  local_100 = &this->m_renderer;
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (local_100,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4.super_RenderParams);
  y = viewport.y;
  iVar7 = viewport.x;
  pRVar3 = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_140,&renderedFrame);
  glu::readPixels(pRVar3,iVar7,y,(PixelBufferAccess *)&local_140);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_140,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar7) + 8),0,0,iVar5,viewport.height);
  local_150.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_150.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_140,&local_150,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4);
  (**(code **)(lVar8 + 0x1a00))
            (viewport.x + iVar5,viewport.y,viewport.width - iVar5,viewport.height);
  local_140.wrapS = 0xbf000000;
  local_140.wrapT = 0x3f400000;
  local_150.m_numLevels = 0x3e800000;
  local_150._4_4_ = 0x3fa00000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)&local_140,(Vec2 *)&local_150);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (local_100,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4.super_RenderParams);
  pRVar3 = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_140,&renderedFrame);
  glu::readPixels(pRVar3,viewport.x,viewport.y,(PixelBufferAccess *)&local_140);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_140,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_03,iVar7) + 8),iVar5,0,viewport.width - iVar5,
             viewport.height);
  local_150.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_150.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_140,&local_150,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4);
  bVar4 = glu::TextureTestUtil::compareImages(log,&referenceFrame,&renderedFrame,threshold);
  description = "Image comparison failed";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar4,description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

TextureWrapCase::IterateResult TextureWrapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	bool					isCompressedTex		= !m_filenames.empty();
	ReferenceParams			refParams			(TEXTURETYPE_2D);
	int						leftWidth			= viewport.width / 2;
	int						rightWidth			= viewport.width - leftWidth;
	vector<float>			texCoord;
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()
												+ (isCompressedTex ? tcu::RGBA(7,7,7,7) : tcu::RGBA(3,3,3,3));

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup filtering and wrap modes.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Parameters for reference images.
	refParams.sampler	= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.lodMode	= LODMODE_EXACT;

	// Left: minification
	{
		gl.viewport(viewport.x, viewport.y, leftWidth, viewport.height);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-1.5f, -3.0f), tcu::Vec2(1.5f, 2.5f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, viewport.height),
					  m_texture->getRefTexture(), &texCoord[0], refParams);
	}

	// Right: magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y, rightWidth, viewport.height);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, viewport.height),
					  m_texture->getRefTexture(), &texCoord[0], refParams);
	}

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}